

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseValueType(WastParser *this,Var *out_type)

{
  char cVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  Enum index;
  long lVar5;
  allocator<char> local_195;
  allocator<char> local_194;
  allocator<char> local_193;
  allocator<char> local_192;
  allocator<char> local_191;
  Type type;
  Token token;
  Location local_128;
  undefined1 local_108 [64];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  bVar2 = PeekMatchRefType(this);
  TVar3 = Peek(this,0);
  if ((!bVar2) && (TVar3 != First_Type)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"i32",(allocator<char> *)&local_128);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_108 + 0x20),"i64",(allocator<char> *)&type);
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"f32",&local_191);
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"f64",&local_192);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"v128",&local_193);
    std::__cxx11::string::string<std::allocator<char>>(local_68,"externref",&local_194);
    std::__cxx11::string::string<std::allocator<char>>(local_48,"funcref",&local_195);
    token.loc.filename._M_len = 0;
    token.loc.filename._M_str = (char *)0x0;
    token.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&token,
               (string *)local_108,&stack0xffffffffffffffd8);
    RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&token,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&token);
    lVar5 = 0xc0;
    do {
      std::__cxx11::string::_M_dispose();
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    return (Result)RVar4.enum_;
  }
  if (bVar2) {
    RVar4 = Expect(this,Lpar);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    RVar4 = Expect(this,Ref);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    RVar4 = ParseVar(this,out_type);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    RVar4 = Expect(this,Rpar);
    return (Result)(uint)(RVar4.enum_ == Error);
  }
  Consume(&token,this);
  type = Token::type(&token);
  index = type.enum_;
  if ((uint)(index + 0x11) < 2) {
    cVar1 = (this->options_->features).reference_types_enabled_;
  }
  else {
    if (index != V128) goto LAB_001353cb;
    cVar1 = (this->options_->features).simd_enabled_;
  }
  if (cVar1 == '\0') {
    Type::GetName_abi_cxx11_((string *)local_108,&type);
    Error(this,0x172b27,(char *)local_108._0_8_);
    std::__cxx11::string::_M_dispose();
    return (Result)Error;
  }
LAB_001353cb:
  GetLocation(&local_128,this);
  Var::Var((Var *)local_108,index,&local_128);
  Var::operator=(out_type,(Var *)local_108);
  Var::~Var((Var *)local_108);
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseValueType(Var* out_type) {
  WABT_TRACE(ParseValueType);

  const bool is_ref_type = PeekMatchRefType();
  const bool is_value_type = PeekMatch(TokenType::ValueType);

  if (!is_value_type && !is_ref_type) {
    return ErrorExpected(
        {"i32", "i64", "f32", "f64", "v128", "externref", "funcref"});
  }

  if (is_ref_type) {
    EXPECT(Lpar);
    EXPECT(Ref);
    CHECK_RESULT(ParseVar(out_type));
    EXPECT(Rpar);
    return Result::Ok;
  }

  Token token = Consume();
  Type type = token.type();
  bool is_enabled;
  switch (type) {
    case Type::V128:
      is_enabled = options_->features.simd_enabled();
      break;
    case Type::FuncRef:
    case Type::ExternRef:
      is_enabled = options_->features.reference_types_enabled();
      break;
    default:
      is_enabled = true;
      break;
  }

  if (!is_enabled) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = Var(type, GetLocation());
  return Result::Ok;
}